

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_relaxed.h
# Opt level: O1

Allocation * __thiscall
density::detail::
LFQueue_Tail<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
::try_inplace_allocate_impl<(density::detail::LfQueue_ProgressGuarantee)1>
          (Allocation *__return_storage_ptr__,
          LFQueue_Tail<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
          *this,uintptr_t i_control_bits,bool i_include_type,size_t i_size,size_t i_alignment)

{
  uintptr_t uint_pointer_1;
  LfQueueControl *pLVar1;
  LfQueueControl *i_tail;
  ulong i_size_00;
  size_t i_alignment_00;
  void *pvVar2;
  ControlBlock *new_block;
  ulong uVar3;
  bool bVar4;
  
  if (7 < i_control_bits) {
    density_tests::detail::assert_failed<>
              ("(i_control_bits & ~(LfQueue_Busy | LfQueue_Dead | LfQueue_External)) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_relaxed.h"
               ,0x7a);
  }
  if (((i_alignment & i_alignment - 1) != 0) || (i_size % i_alignment != 0)) {
    density_tests::detail::assert_failed<>
              ("is_power_of_2(i_alignment) && (i_size % i_alignment) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_relaxed.h"
               ,0x7b);
  }
  i_alignment_00 = 8;
  if (8 < i_alignment) {
    i_alignment_00 = i_alignment;
  }
  i_size_00 = i_size + 7 & 0xfffffffffffffff8;
  if (7 < i_alignment) {
    i_size_00 = i_size;
  }
  i_tail = (LfQueueControl *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
  do {
    while( true ) {
      if (i_tail == (LfQueueControl *)0x0 || ((ulong)i_tail & 0x3f) != 0) {
        density_tests::detail::assert_failed<>
                  ("tail != 0 && uint_is_aligned(tail, s_alloc_granularity)",
                   "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_relaxed.h"
                   ,0x89);
      }
      pvVar2 = (void *)((long)&i_tail[i_include_type].m_next + i_alignment_00 + 7 & -i_alignment_00)
      ;
      uVar3 = i_size_00 + 0x3f + (long)pvVar2 & 0xffffffffffffffc0;
      if (0xffc0 < uVar3 - ((ulong)i_tail & 0xffffffffffff0000)) break;
      LOCK();
      pLVar1 = (LfQueueControl *)(this->m_tail).super___atomic_base<unsigned_long>._M_i;
      bVar4 = i_tail == pLVar1;
      if (bVar4) {
        (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar3;
        pLVar1 = i_tail;
      }
      UNLOCK();
      i_tail = pLVar1;
      if (bVar4) {
        if (pLVar1->m_next != 0) {
          density_tests::detail::assert_failed<>
                    ("raw_atomic_load(&new_block->m_next, mem_relaxed) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_relaxed.h"
                     ,0xab);
        }
        LOCK();
        pLVar1->m_next = uVar3 + i_control_bits;
        UNLOCK();
        if ((LfQueueControl *)((ulong)pLVar1 & 0xffffffffffff0000 | 0xffc0) <= pLVar1) {
          density_tests::detail::assert_failed<>
                    ("new_block < get_end_control_block(new_block)",
                     "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/detail/lf_queue_tail_multiple_relaxed.h"
                     ,0xb0);
        }
        __return_storage_ptr__->m_control_block = pLVar1;
        __return_storage_ptr__->m_next_ptr = uVar3 + i_control_bits;
        __return_storage_ptr__->m_user_storage = pvVar2;
        return __return_storage_ptr__;
      }
    }
    if (0xffb0 < (i_alignment_00 + i_size_00) - 8) {
      LFQueue_Base<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
      ::external_allocate<(density::detail::LfQueue_ProgressGuarantee)1>
                (__return_storage_ptr__,
                 (LFQueue_Base<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::detail::LFQueue_Tail<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>_>
                  *)this,i_control_bits,i_size_00,i_alignment_00);
      return __return_storage_ptr__;
    }
    i_tail = (LfQueueControl *)page_overflow(this,LfQueue_Blocking,(uintptr_t)i_tail);
  } while (i_tail != (LfQueueControl *)0x0);
  __return_storage_ptr__->m_user_storage = (void *)0x0;
  return __return_storage_ptr__;
}

Assistant:

Allocation try_inplace_allocate_impl(
              uintptr_t i_control_bits,
              bool      i_include_type,
              size_t    i_size,
              size_t    i_alignment) noexcept(PROGRESS_GUARANTEE != LfQueue_Throwing)
            {
                auto guarantee =
                  PROGRESS_GUARANTEE; // used to avoid warnings about constant conditional expressions

                DENSITY_ASSERT_INTERNAL(
                  (i_control_bits & ~(LfQueue_Busy | LfQueue_Dead | LfQueue_External)) == 0);
                DENSITY_ASSERT_INTERNAL(is_power_of_2(i_alignment) && (i_size % i_alignment) == 0);

                if (i_alignment < min_alignment)
                {
                    i_alignment = min_alignment;
                    i_size      = uint_upper_align(i_size, min_alignment);
                }

                /* Operations on m_tail are mostly relaxed, because the ordering is done when accessing
                    the member m_next of the control blocks. */
                auto tail = m_tail.load(mem_relaxed);
                for (;;)
                {
                    DENSITY_ASSERT_INTERNAL(
                      tail != 0 && uint_is_aligned(tail, s_alloc_granularity));

                    // allocate space for the control block (and possibly the runtime type)
                    auto new_tail =
                      tail + (i_include_type ? s_element_min_offset : s_rawblock_min_offset);

                    // allocate the user space
                    new_tail                = uint_upper_align(new_tail, i_alignment);
                    auto const user_storage = reinterpret_cast<void *>(new_tail);
                    new_tail = uint_upper_align(new_tail + i_size, s_alloc_granularity);

                    // check for page overflow
                    auto const page_start = uint_lower_align(tail, ALLOCATOR_TYPE::page_alignment);
                    DENSITY_ASSUME(new_tail > page_start);
                    auto const new_tail_offset = new_tail - page_start;
                    if (DENSITY_LIKELY(new_tail_offset <= s_end_control_offset))
                    {
                        /* No page overflow occurs with the new tail we have computed. */
                        if (m_tail.compare_exchange_weak(tail, new_tail, mem_relaxed, mem_relaxed))
                        {
                            /* At this point this thread has truncated the queue, because it has allocated
                               an element, but the member m_next of its control point is still zeroed (the
                               initial content of a newly allocated page).
                               Other threads may still put elements, but they will be not visible to the consumers
                               until the next store is completed. This is one of the reasons why this class 
                               is not sequential consistent. 
                               
                               The next store is safe because the zeroed block is a barrier that consumers will
                               not get over, so this page can't be deallocated. If this block does not have the 
                               dead 'flag', the access to this page is safe until the element is committed or canceled. */

                            // initialize the control block
                            auto const new_block = reinterpret_cast<ControlBlock *>(tail);
                            DENSITY_ASSERT_INTERNAL(
                              raw_atomic_load(&new_block->m_next, mem_relaxed) == 0);
                            auto const next_ptr = new_tail + i_control_bits;
                            raw_atomic_store(&new_block->m_next, next_ptr, mem_relaxed);

                            // successful
                            DENSITY_ASSERT_INTERNAL(new_block < get_end_control_block(new_block));
                            return {new_block, next_ptr, user_storage};
                        }
                        else
                        {
                            if (guarantee == LfQueue_WaitFree)
                            {
                                // don't retry
                                return Allocation{};
                            }
                        }
                    }
                    else if (
                      i_size + (i_alignment - min_alignment) <=
                      s_max_size_inpage) // if this allocation may fit in a page
                    {
                        tail = page_overflow(guarantee, tail);
                        if (guarantee != LfQueue_Throwing)
                        {
                            if (tail == 0)
                            {
                                return Allocation{};
                            }
                        }
                        else
                        {
                            DENSITY_ASSUME(tail != 0);
                        }
                    }
                    else // this allocation would never fit in a page, allocate an external block
                    {
                        // legacy heap allocations can only be blocking
                        if (guarantee == LfQueue_LockFree || guarantee == LfQueue_WaitFree)
                            return Allocation{};

                        return Base::template external_allocate<PROGRESS_GUARANTEE>(
                          i_control_bits, i_size, i_alignment);
                    }
                }
            }